

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_prefix(FuncState *fs,UnOpr opr,expdesc *e,int line)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  Instruction *pIVar4;
  
  luaK_dischargevars(fs,e);
  if (opr < OPR_NOT) {
    iVar3 = constfolding(fs,opr + 0xc,e,&luaK_prefix::ef);
    if (iVar3 != 0) {
      return;
    }
  }
  else {
    if (opr == OPR_NOT) {
      switch(e->k) {
      case VNIL:
      case VFALSE:
        e->k = VTRUE;
        break;
      case VTRUE:
      case VK:
      case VKFLT:
      case VKINT:
      case VKSTR:
        e->k = VFALSE;
        break;
      case VNONRELOC:
      case VRELOC:
        discharge2anyreg(fs,e);
        if ((e->k == VNONRELOC) &&
           (iVar3 = (e->u).info, bVar2 = luaY_nvarstack(fs), (int)(uint)bVar2 <= iVar3)) {
          fs->freereg = fs->freereg + 0xff;
        }
        iVar3 = luaK_code(fs,(e->u).info << 0x10 | 0x33);
        (e->u).info = iVar3;
        e->k = VRELOC;
        break;
      case VJMP:
        pIVar4 = fs->f->code + (e->u).info;
        if ((0 < (long)(e->u).info) && (("\b\v\v\n\n\b\b\b\b\b"[pIVar4[-1] & 0x7f] & 0x10) != 0)) {
          pIVar4 = pIVar4 + -1;
        }
        *(byte *)((long)pIVar4 + 1) = *(byte *)((long)pIVar4 + 1) ^ 0x80;
      }
      iVar3 = e->t;
      iVar1 = e->f;
      e->f = iVar3;
      e->t = iVar1;
      removevalues(fs,iVar3);
      removevalues(fs,e->t);
      return;
    }
    if (opr != OPR_LEN) {
      return;
    }
  }
  iVar3 = luaK_exp2anyreg(fs,e);
  if ((e->k == VNONRELOC) &&
     (iVar1 = (e->u).info, bVar2 = luaY_nvarstack(fs), (int)(uint)bVar2 <= iVar1)) {
    fs->freereg = fs->freereg + 0xff;
  }
  iVar3 = luaK_code(fs,iVar3 << 0x10 | opr + 0x31);
  (e->u).info = iVar3;
  e->k = VRELOC;
  luaK_fixline(fs,line);
  return;
}

Assistant:

void luaK_prefix (FuncState *fs, UnOpr opr, expdesc *e, int line) {
  static const expdesc ef = {VKINT, {0}, NO_JUMP, NO_JUMP};
  luaK_dischargevars(fs, e);
  switch (opr) {
    case OPR_MINUS: case OPR_BNOT:  /* use 'ef' as fake 2nd operand */
      if (constfolding(fs, cast_int(opr + LUA_OPUNM), e, &ef))
        break;
      /* else */ /* FALLTHROUGH */
    case OPR_LEN:
      codeunexpval(fs, unopr2op(opr), e, line);
      break;
    case OPR_NOT: codenot(fs, e); break;
    default: lua_assert(0);
  }
}